

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int isodate7_valid(uchar *v)

{
  byte bVar1;
  byte bVar2;
  uchar uVar3;
  int gmt_off;
  int second;
  int minute;
  int hour;
  int day;
  int month;
  int year;
  uchar *v_local;
  
  bVar1 = v[1];
  bVar2 = v[2];
  uVar3 = v[6];
  if (((((*v == '\0') && (bVar1 == 0)) && (bVar2 == 0)) && ((v[3] == 0 && (v[4] == 0)))) &&
     ((v[5] == 0 && (uVar3 == '\0')))) {
    v_local._4_4_ = 0;
  }
  else if ((bVar1 == 0) || (0xc < bVar1)) {
    v_local._4_4_ = 0;
  }
  else if ((bVar2 == 0) || (0x1f < bVar2)) {
    v_local._4_4_ = 0;
  }
  else if (v[3] < 0x18) {
    if (v[4] < 0x3c) {
      if (v[5] < 0x3e) {
        if (((char)uVar3 < -0x30) || ('4' < (char)uVar3)) {
          v_local._4_4_ = 0;
        }
        else {
          v_local._4_4_ = 1;
        }
      }
      else {
        v_local._4_4_ = 0;
      }
    }
    else {
      v_local._4_4_ = 0;
    }
  }
  else {
    v_local._4_4_ = 0;
  }
  return v_local._4_4_;
}

Assistant:

static int
isodate7_valid(const unsigned char *v)
{
	int year = v[0];
	int month = v[1];
	int day = v[2];
	int hour = v[3];
	int minute = v[4];
	int second = v[5];
	int gmt_off = (signed char)v[6];

	/* ECMA-119 9.1.5 "If all seven values are zero, it shall mean
	 * that the date is unspecified" */
	if (year == 0
	    && month == 0
	    && day == 0
	    && hour == 0
	    && minute == 0
	    && second == 0
	    && gmt_off == 0)
		return 0;
	/*
	 * Sanity-test each individual field
	 */
	/* Year can have any value */
	/* Month must be 1-12 */
	if (month < 1 || month > 12)
		return 0;
	/* Day must be 1-31 */
	if (day < 1 || day > 31)
		return 0;
	/* Hour must be 0-23 */
	if (hour > 23)
		return 0;
	/* Minute must be 0-59 */
	if (minute > 59)
		return 0;
	/* second must be 0-59 according to ECMA-119 9.1.5 */
	/* BUT: we should probably allow for the time being in UTC, which
	   allows up to 61 seconds in a minute in certain cases */
	if (second > 61)
		return 0;
	/* Offset from GMT must be -48 to +52 */
	if (gmt_off < -48 || gmt_off > +52)
		return 0;

	/* All tests pass, this is OK */
	return 1;
}